

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsql_sqlite_vfs.cpp
# Opt level: O3

int anon_unknown.dwarf_43935::xRead(sqlite3_file *sfile,void *ptr,int iAmt,sqlite3_int64 iOfst)

{
  char cVar1;
  int iVar2;
  long lVar3;
  size_t __n;
  
  cVar1 = (**(code **)(*(long *)sfile[1].pMethods + 0x88))(sfile[1].pMethods,iOfst);
  iVar2 = 0x10a;
  if (cVar1 != '\0') {
    lVar3 = QIODevice::read((char *)sfile[1].pMethods,(longlong)ptr);
    iVar2 = 0;
    __n = iAmt - lVar3;
    if (__n != 0 && lVar3 <= iAmt) {
      memset((void *)((long)ptr + lVar3),0,__n);
      iVar2 = 0x20a;
    }
  }
  return iVar2;
}

Assistant:

int xRead(sqlite3_file *sfile, void *ptr, int iAmt, sqlite3_int64 iOfst)
{
    auto file = static_cast<File *>(sfile);
    if (!file->pFile->seek(iOfst))
        return SQLITE_IOERR_READ;

    auto sz = file->pFile->read(static_cast<char *>(ptr), iAmt);
    if (sz < iAmt) {
        memset(static_cast<char *>(ptr) + sz, 0, size_t(iAmt - sz));
        return SQLITE_IOERR_SHORT_READ;
    }
    return SQLITE_OK;
}